

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  anon_class_8_1_8991fb9c_for_f in_RCX;
  string_view s_00;
  wchar_t local_50 [4];
  utf8_to_utf16 *local_40;
  utf8_to_utf16 *local_38;
  char *pcStack_30;
  allocator<wchar_t> local_21;
  utf8_to_utf16 *local_20;
  utf8_to_utf16 *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (utf8_to_utf16 *)s.data_;
  local_20 = this;
  basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_>::basic_memory_buffer
            (&this->buffer_,&local_21);
  local_38 = this_local;
  pcStack_30 = s_local.data_;
  s_00.size_ = (size_t)this;
  s_00.data_ = s_local.data_;
  local_40 = this;
  for_each_codepoint<fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(fmt::v11::basic_string_view<char>)::__0>
            ((detail *)this_local,s_00,in_RCX);
  local_50[0] = L'\0';
  buffer<wchar_t>::push_back((buffer<wchar_t> *)this,local_50);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}